

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seahash.c
# Opt level: O0

uint64_t seahash(char *key,int len,uint64_t seed)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong *puVar3;
  ulong in_RDX;
  int in_ESI;
  ulong *in_RDI;
  uint64_t orig_len;
  uint8_t pad [8];
  uint64_t *p;
  uint64_t s;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  ulong local_50;
  ulong *local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  int local_c;
  ulong *local_8;
  
  local_40 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(&local_50,0,8);
  uVar1 = (ulong)local_c;
  local_20 = local_40 ^ 0x16f11fe89b0d677c;
  local_28 = 0xb480a793d8e6c86c;
  local_30 = 0x6fe2e5aaf078ebc9;
  local_38 = 0x14f994a4c5259381;
  local_48 = local_8;
  for (; 0x1f < local_c; local_c = local_c + -0x20) {
    local_20 = *local_48 ^ local_20;
    local_28 = local_48[1] ^ local_28;
    puVar3 = local_48 + 3;
    local_30 = local_48[2] ^ local_30;
    local_48 = local_48 + 4;
    local_38 = *puVar3 ^ local_38;
    local_20 = diffuse(local_20);
    local_28 = diffuse(local_28);
    local_30 = diffuse(local_30);
    local_38 = diffuse(local_38);
  }
  switch(local_c) {
  case 0:
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    memcpy(&local_50,local_48,(long)local_c);
    local_20 = local_50 ^ local_20;
    local_20 = diffuse(local_20);
    break;
  case 8:
    local_20 = *local_48 ^ local_20;
    local_48 = local_48 + 1;
    local_20 = diffuse(local_20);
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    puVar3 = local_48 + 1;
    local_20 = *local_48 ^ local_20;
    local_48 = puVar3;
    memcpy(&local_50,puVar3,(long)(local_c + -8));
    local_28 = local_50 ^ local_28;
    local_20 = diffuse(local_20);
    local_28 = diffuse(local_28);
    break;
  case 0x10:
    puVar3 = local_48 + 1;
    local_20 = *local_48 ^ local_20;
    local_48 = local_48 + 2;
    local_28 = *puVar3 ^ local_28;
    local_20 = diffuse(local_20);
    local_28 = diffuse(local_28);
    break;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    puVar3 = local_48 + 1;
    local_20 = *local_48 ^ local_20;
    local_48 = local_48 + 2;
    local_28 = *puVar3 ^ local_28;
    memcpy(&local_50,local_48,(long)(local_c + -0x10));
    local_30 = local_50 ^ local_30;
    local_20 = diffuse(local_20);
    local_28 = diffuse(local_28);
    local_30 = diffuse(local_30);
    break;
  case 0x18:
    local_20 = *local_48 ^ local_20;
    puVar3 = local_48 + 2;
    local_28 = local_48[1] ^ local_28;
    local_48 = local_48 + 3;
    local_30 = *puVar3 ^ local_30;
    local_20 = diffuse(local_20);
    local_28 = diffuse(local_28);
    local_30 = diffuse(local_30);
    break;
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    local_20 = *local_48 ^ local_20;
    puVar3 = local_48 + 2;
    local_28 = local_48[1] ^ local_28;
    local_48 = local_48 + 3;
    local_30 = *puVar3 ^ local_30;
    memcpy(&local_50,local_48,(long)(local_c + -0x18));
    local_38 = local_50 ^ local_38;
    local_20 = diffuse(local_20);
    local_28 = diffuse(local_28);
    local_30 = diffuse(local_30);
    local_38 = diffuse(local_38);
  }
  local_30 = local_38 ^ local_30;
  local_20 = uVar1 ^ local_30 ^ local_28 ^ local_20;
  uVar2 = diffuse(local_20);
  uVar2 = sea_swap64(uVar2);
  return uVar2;
}

Assistant:

uint64_t seahash(const char *key, int len, uint64_t seed) {
  uint64_t a, b, c, d;
  uint64_t s = seed;
  uint64_t *p;
  uint8_t pad[8] = {0};
  const uint64_t orig_len = (uint64_t)len;

  a = 0x16f11fe89b0d677cULL ^ s;
  b = 0xb480a793d8e6c86cULL;
  c = 0x6fe2e5aaf078ebc9ULL;
  d = 0x14f994a4c5259381ULL;

  p = (uint64_t *)key;
  while (len >= 32) {
    a ^= *p++;
    b ^= *p++;
    c ^= *p++;
    d ^= *p++;
    a = diffuse(a);
    b = diffuse(b);
    c = diffuse(c);
    d = diffuse(d);
    len -= 32;
  }

  switch (len) {
    // illegal msvc 15 syntax
    case 25 ... 31:
      a ^= *p++;
      b ^= *p++;
      c ^= *p++;
      memcpy(pad, p, len - 24);
      d ^= *(uint64_t *)pad;
      a = diffuse(a);
      b = diffuse(b);
      c = diffuse(c);
      d = diffuse(d);
      break;
    case 24:
      a ^= *p++;
      b ^= *p++;
      c ^= *p++;
      a = diffuse(a);
      b = diffuse(b);
      c = diffuse(c);
      break;
    case 17 ... 23:
      a ^= *p++;
      b ^= *p++;
      memcpy(pad, p, len - 16);
      c ^= *(uint64_t *)pad;
      a = diffuse(a);
      b = diffuse(b);
      c = diffuse(c);
      break;
    case 16:
      a ^= *p++;
      b ^= *p++;
      a = diffuse(a);
      b = diffuse(b);
      break;
    case 9 ... 15:
      a ^= *p++;
      memcpy(pad, p, len - 8);
      b ^= *(uint64_t *)pad;
      a = diffuse(a);
      b = diffuse(b);
      break;
    case 8:
      a ^= *p++;
      a = diffuse(a);
      break;
    case 1 ... 7:
      memcpy(pad, p, len);
      a ^= *(uint64_t *)pad;
      a = diffuse(a);
      break;
    case 0:
      break;
    default:
      assert(0);
  }

  a ^= b;
  c ^= d;
  a ^= c;
  a ^= orig_len;
  return sea_swap64(diffuse(a));
}